

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_calledWithoutParameters_TestShell::
~TEST_MockParameterTest_calledWithoutParameters_TestShell
          (TEST_MockParameterTest_calledWithoutParameters_TestShell *this)

{
  TEST_MockParameterTest_calledWithoutParameters_TestShell *this_local;
  
  ~TEST_MockParameterTest_calledWithoutParameters_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockParameterTest, calledWithoutParameters)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("p1", 1);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withParameter("p1", 1);
    mock().actualCall("foo");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}